

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O1

h__TextParser * __thiscall
AS_02::TimedText::ST2052_TextParser::h__TextParser::OpenRead(h__TextParser *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  size_t __n;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  _Rb_tree_node_base *p_Var6;
  char cVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  _Base_ptr p_Var11;
  _List_node_base *p_Var12;
  ILogSink *pIVar13;
  char *__s;
  iterator iVar14;
  string *in_RSI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  AttributeVisitor png_visitor;
  AttributeVisitor font_visitor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char buf [64];
  UUID font_id;
  AttributeVisitor local_1e0;
  string *local_190;
  _Rb_tree_node_base *local_188;
  _func_int **local_180;
  undefined1 local_178 [8];
  bool local_170;
  byte_t abStack_16f [7];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_168;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  long *local_128;
  long *local_120 [2];
  long local_110 [2];
  undefined1 local_100 [17];
  byte_t abStack_ef [7];
  byte_t bStack_e8;
  MIMEType_t local_e0;
  h__TextParser *local_d8;
  string *local_d0;
  long *local_c8 [2];
  long local_b8 [2];
  _List_node_base *local_a8;
  _List_node_base *p_Stack_a0;
  undefined1 local_98 [17];
  byte_t abStack_87 [7];
  byte_t bStack_80;
  undefined1 local_50 [17];
  _List_node_base *p_Stack_3f;
  
  pthread_mutex_lock((pthread_mutex_t *)&sg_default_font_family_list_lock);
  paVar15 = &local_1e0.attr_name.field_2;
  local_1e0.attr_name.field_2._M_allocated_capacity._0_4_ = 0x61666564;
  local_1e0.attr_name.field_2._M_allocated_capacity._4_2_ = 0x6c75;
  local_1e0.attr_name.field_2._M_local_buf[6] = 't';
  local_1e0.attr_name._M_string_length = 7;
  local_1e0.attr_name.field_2._M_local_buf[7] = '\0';
  local_1e0.attr_name._M_dataplus._M_p = (pointer)paVar15;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&local_1e0.attr_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.attr_name._M_dataplus._M_p != paVar15) {
    operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                    CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                             CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                      CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity.
                                               _4_2_,local_1e0.attr_name.field_2.
                                                     _M_allocated_capacity._0_4_))) + 1);
  }
  paVar15 = &local_1e0.attr_name.field_2;
  local_1e0.attr_name.field_2._M_allocated_capacity._0_4_ = 0x6f6e6f6d;
  local_1e0.attr_name.field_2._M_allocated_capacity._4_2_ = 0x7073;
  local_1e0.attr_name.field_2._M_local_buf[6] = 'a';
  local_1e0.attr_name.field_2._M_local_buf[7] = 'c';
  local_1e0.attr_name.field_2._8_2_ = 0x65;
  local_1e0.attr_name._M_string_length = 9;
  local_1e0.attr_name._M_dataplus._M_p = (pointer)paVar15;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&local_1e0.attr_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.attr_name._M_dataplus._M_p != paVar15) {
    operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                    CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                             CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                      CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity.
                                               _4_2_,local_1e0.attr_name.field_2.
                                                     _M_allocated_capacity._0_4_))) + 1);
  }
  paVar15 = &local_1e0.attr_name.field_2;
  local_1e0.attr_name.field_2._M_allocated_capacity._0_4_ = 0x736e6173;
  local_1e0.attr_name.field_2._M_allocated_capacity._4_2_ = 0x6553;
  local_1e0.attr_name.field_2._M_local_buf[6] = 'r';
  local_1e0.attr_name.field_2._M_local_buf[7] = 'i';
  local_1e0.attr_name.field_2._8_2_ = 0x66;
  local_1e0.attr_name._M_string_length = 9;
  local_1e0.attr_name._M_dataplus._M_p = (pointer)paVar15;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&local_1e0.attr_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.attr_name._M_dataplus._M_p != paVar15) {
    operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                    CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                             CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                      CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity.
                                               _4_2_,local_1e0.attr_name.field_2.
                                                     _M_allocated_capacity._0_4_))) + 1);
  }
  paVar15 = &local_1e0.attr_name.field_2;
  local_1e0.attr_name.field_2._M_allocated_capacity._0_4_ = 0x69726573;
  local_1e0.attr_name.field_2._M_allocated_capacity._4_2_ = 0x66;
  local_1e0.attr_name._M_string_length = 5;
  local_1e0.attr_name._M_dataplus._M_p = (pointer)paVar15;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&local_1e0.attr_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.attr_name._M_dataplus._M_p != paVar15) {
    operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                    CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                             CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                      CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity.
                                               _4_2_,local_1e0.attr_name.field_2.
                                                     _M_allocated_capacity._0_4_))) + 1);
  }
  local_1e0.attr_name._M_dataplus._M_p = (pointer)&local_1e0.attr_name.field_2;
  local_178 = (undefined1  [8])0x12;
  local_1e0.attr_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)local_178);
  local_1e0.attr_name.field_2._M_allocated_capacity._0_4_ = local_178._0_4_;
  local_1e0.attr_name.field_2._M_allocated_capacity._4_2_ = local_178._4_2_;
  local_1e0.attr_name.field_2._M_local_buf[6] = local_178[6];
  local_1e0.attr_name.field_2._M_local_buf[7] = local_178[7];
  builtin_strncpy(local_1e0.attr_name._M_dataplus._M_p,"monospaceSansSerif",0x12);
  local_1e0.attr_name._M_string_length = (size_type)local_178;
  local_1e0.attr_name._M_dataplus._M_p[(long)local_178] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&local_1e0.attr_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.attr_name._M_dataplus._M_p != &local_1e0.attr_name.field_2) {
    operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                    CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                             CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                      CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity.
                                               _4_2_,local_1e0.attr_name.field_2.
                                                     _M_allocated_capacity._0_4_))) + 1);
  }
  paVar15 = &local_1e0.attr_name.field_2;
  local_1e0.attr_name.field_2._M_allocated_capacity._0_4_ = 0x6f6e6f6d;
  local_1e0.attr_name.field_2._M_allocated_capacity._4_2_ = 0x7073;
  local_1e0.attr_name.field_2._M_local_buf[6] = 'a';
  local_1e0.attr_name.field_2._M_local_buf[7] = 'c';
  local_1e0.attr_name.field_2._8_2_ = 0x5365;
  local_1e0.attr_name.field_2._10_4_ = 0x66697265;
  local_1e0.attr_name._M_string_length = 0xe;
  local_1e0.attr_name.field_2._M_local_buf[0xe] = '\0';
  local_1e0.attr_name._M_dataplus._M_p = (pointer)paVar15;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&local_1e0.attr_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.attr_name._M_dataplus._M_p != paVar15) {
    operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                    CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                             CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                      CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity.
                                               _4_2_,local_1e0.attr_name.field_2.
                                                     _M_allocated_capacity._0_4_))) + 1);
  }
  local_1e0.attr_name._M_dataplus._M_p = (pointer)&local_1e0.attr_name.field_2;
  local_178 = (undefined1  [8])0x15;
  local_1e0.attr_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)local_178);
  local_1e0.attr_name.field_2._M_allocated_capacity._0_4_ = local_178._0_4_;
  local_1e0.attr_name.field_2._M_allocated_capacity._4_2_ = local_178._4_2_;
  local_1e0.attr_name.field_2._M_local_buf[6] = local_178[6];
  local_1e0.attr_name.field_2._M_local_buf[7] = local_178[7];
  builtin_strncpy(local_1e0.attr_name._M_dataplus._M_p,"proportionalSansSerif",0x15);
  local_1e0.attr_name._M_string_length = (size_type)local_178;
  local_1e0.attr_name._M_dataplus._M_p[(long)local_178] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&local_1e0.attr_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.attr_name._M_dataplus._M_p != &local_1e0.attr_name.field_2) {
    operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                    CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                             CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                      CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity.
                                               _4_2_,local_1e0.attr_name.field_2.
                                                     _M_allocated_capacity._0_4_))) + 1);
  }
  local_1e0.attr_name._M_dataplus._M_p = (pointer)&local_1e0.attr_name.field_2;
  local_178 = (undefined1  [8])0x11;
  local_1e0.attr_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)local_178);
  local_1e0.attr_name.field_2._M_allocated_capacity._0_4_ = local_178._0_4_;
  local_1e0.attr_name.field_2._M_allocated_capacity._4_2_ = local_178._4_2_;
  local_1e0.attr_name.field_2._M_local_buf[6] = local_178[6];
  local_1e0.attr_name.field_2._M_local_buf[7] = local_178[7];
  *(undefined8 *)local_1e0.attr_name._M_dataplus._M_p = 0x6974726f706f7270;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.attr_name._M_dataplus._M_p + 8) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.attr_name._M_dataplus._M_p + 9) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.attr_name._M_dataplus._M_p + 10) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.attr_name._M_dataplus._M_p + 0xb) = 'l';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.attr_name._M_dataplus._M_p + 0xc) = 'S';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.attr_name._M_dataplus._M_p + 0xd) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.attr_name._M_dataplus._M_p + 0xe) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0.attr_name._M_dataplus._M_p + 0xf) = 'i';
  local_1e0.attr_name._M_dataplus._M_p[0x10] = 'f';
  local_1e0.attr_name._M_string_length = (size_type)local_178;
  local_1e0.attr_name._M_dataplus._M_p[(long)local_178] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&local_1e0.attr_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.attr_name._M_dataplus._M_p != &local_1e0.attr_name.field_2) {
    operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                    CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                             CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                      CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity.
                                               _4_2_,local_1e0.attr_name.field_2.
                                                     _M_allocated_capacity._0_4_))) + 1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&sg_default_font_family_list_lock);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,*(char **)(in_RSI + 0xd0),(allocator<char> *)local_178);
  cVar7 = Kumu::XMLElement::ParseString(in_RSI);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.attr_name._M_dataplus._M_p != &local_1e0.attr_name.field_2) {
    operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                    CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                             CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                      CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity.
                                               _4_2_,local_1e0.attr_name.field_2.
                                                     _M_allocated_capacity._0_4_))) + 1);
  }
  if (cVar7 == '\0') {
    pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar13,"ST 2052-1 document is not well-formed.\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)(in_RSI + 0x130),0,*(char **)(in_RSI + 0x138),0x15cf78);
    local_d0 = in_RSI + 0x150;
    std::__cxx11::
    list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
    ::clear((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
             *)local_d0);
    *(undefined4 *)(in_RSI + 0xf8) = 0;
    local_190 = in_RSI + 0x110;
    local_d8 = this;
    if (*(long *)(in_RSI + 0x118) == 0) {
      local_178 = (undefined1  [8])&aStack_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"conformsToStandard","");
      local_1e0.attr_name._M_dataplus._M_p = (pointer)&local_1e0.attr_name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,local_178,
                 (char *)((long)local_178 + CONCAT71(abStack_16f,local_170)));
      p_Var1 = &local_1e0.value_list._M_t._M_impl.super__Rb_tree_header;
      local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
      ;
      local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      if (local_178 != (undefined1  [8])&aStack_168) {
        operator_delete((void *)local_178,
                        CONCAT71(aStack_168._M_allocated_capacity._1_7_,aStack_168._M_local_buf[0])
                        + 1);
      }
      Kumu::apply_visitor<Kumu::ElementVisitor>((XMLElement *)in_RSI,(ElementVisitor *)&local_1e0);
      sVar5 = IMSC1_textProfile_abi_cxx11_._M_string_length;
      sVar4 = IMSC1_imageProfile_abi_cxx11_._M_string_length;
      if ((_Rb_tree_header *)
          local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
        local_188 = (_Rb_tree_node_base *)IMSC1_imageProfile_abi_cxx11_._M_dataplus._M_p;
        local_180 = (_func_int **)IMSC1_textProfile_abi_cxx11_._M_dataplus._M_p;
        p_Var11 = local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          p_Var2 = p_Var11[1]._M_parent;
          if (((p_Var2 == (_Base_ptr)sVar4) &&
              ((p_Var2 == (_Base_ptr)0x0 ||
               (iVar10 = bcmp(*(void **)(p_Var11 + 1),local_188,(size_t)p_Var2), iVar10 == 0)))) ||
             ((p_Var2 == (_Base_ptr)sVar5 &&
              ((p_Var2 == (_Base_ptr)0x0 ||
               (iVar10 = bcmp(*(void **)(p_Var11 + 1),local_180,(size_t)p_Var2), iVar10 == 0)))))) {
            std::__cxx11::string::_M_assign(local_190);
            break;
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1e0.value_list._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.attr_name._M_dataplus._M_p != &local_1e0.attr_name.field_2) {
        operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                        CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                                 CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                          CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity
                                                   ._4_2_,local_1e0.attr_name.field_2.
                                                          _M_allocated_capacity._0_4_))) + 1);
      }
    }
    if (*(long *)(in_RSI + 0x118) == 0) {
      local_178 = (undefined1  [8])&aStack_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"profile","");
      local_1e0.attr_name._M_dataplus._M_p = (pointer)&local_1e0.attr_name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,local_178,
                 (char *)((long)local_178 + CONCAT71(abStack_16f,local_170)));
      p_Var1 = &local_1e0.value_list._M_t._M_impl.super__Rb_tree_header;
      local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
      ;
      local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      if (local_178 != (undefined1  [8])&aStack_168) {
        operator_delete((void *)local_178,
                        CONCAT71(aStack_168._M_allocated_capacity._1_7_,aStack_168._M_local_buf[0])
                        + 1);
      }
      Kumu::apply_visitor<Kumu::AttributeVisitor>((XMLElement *)in_RSI,&local_1e0);
      sVar5 = IMSC1_textProfile_abi_cxx11_._M_string_length;
      sVar4 = IMSC1_imageProfile_abi_cxx11_._M_string_length;
      if ((_Rb_tree_header *)
          local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
        local_188 = (_Rb_tree_node_base *)IMSC1_imageProfile_abi_cxx11_._M_dataplus._M_p;
        local_180 = (_func_int **)IMSC1_textProfile_abi_cxx11_._M_dataplus._M_p;
        p_Var11 = local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          p_Var2 = p_Var11[1]._M_parent;
          if (((p_Var2 == (_Base_ptr)sVar4) &&
              ((p_Var2 == (_Base_ptr)0x0 ||
               (iVar10 = bcmp(*(void **)(p_Var11 + 1),local_188,(size_t)p_Var2), iVar10 == 0)))) ||
             ((p_Var2 == (_Base_ptr)sVar5 &&
              ((p_Var2 == (_Base_ptr)0x0 ||
               (iVar10 = bcmp(*(void **)(p_Var11 + 1),local_180,(size_t)p_Var2), iVar10 == 0)))))) {
            std::__cxx11::string::_M_assign(local_190);
            break;
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1e0.value_list._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.attr_name._M_dataplus._M_p != &local_1e0.attr_name.field_2) {
        operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                        CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                                 CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                          CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity
                                                   ._4_2_,local_1e0.attr_name.field_2.
                                                          _M_allocated_capacity._0_4_))) + 1);
      }
    }
    local_178 = (undefined1  [8])&aStack_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"backgroundImage","");
    local_1e0.attr_name._M_dataplus._M_p = (pointer)&local_1e0.attr_name.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e0,local_178,
               (char *)((long)local_178 + CONCAT71(abStack_16f,local_170)));
    local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_178 != (undefined1  [8])&aStack_168) {
      operator_delete((void *)local_178,
                      CONCAT71(aStack_168._M_allocated_capacity._1_7_,aStack_168._M_local_buf[0]) +
                      1);
    }
    Kumu::apply_visitor<Kumu::AttributeVisitor>((XMLElement *)in_RSI,&local_1e0);
    if ((_Rb_tree_header *)local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        != &local_1e0.value_list._M_t._M_impl.super__Rb_tree_header) {
      local_188 = (_Rb_tree_node_base *)(in_RSI + 0x80);
      p_Var11 = local_1e0.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        Kumu::PathBasename((string *)local_178,(char)p_Var11 + ' ');
        create_4122_type5_id((UUID *)local_98,(string *)local_178,s_png_id_prefix);
        if (local_178 != (undefined1  [8])&aStack_168) {
          operator_delete((void *)local_178,
                          CONCAT71(aStack_168._M_allocated_capacity._1_7_,aStack_168._M_local_buf[0]
                                  ) + 1);
        }
        p_Var12 = (_List_node_base *)operator_new(0x28);
        p_Var12[1]._M_next = (_List_node_base *)CONCAT17(local_98[0x10],local_98._9_7_);
        p_Var12[1]._M_prev = (_List_node_base *)CONCAT17(bStack_80,abStack_87);
        *(undefined4 *)&p_Var12[2]._M_next = 1;
        std::__detail::_List_node_base::_M_hook(p_Var12);
        *(long *)(in_RSI + 0x160) = *(long *)(in_RSI + 0x160) + 1;
        aStack_168._M_local_buf[0] = local_98[0x10];
        aStack_168._M_local_buf[1] = abStack_87[0];
        aStack_168._M_local_buf[2] = abStack_87[1];
        aStack_168._M_local_buf[3] = abStack_87[2];
        aStack_168._M_local_buf[4] = abStack_87[3];
        aStack_168._M_local_buf[5] = abStack_87[4];
        aStack_168._M_local_buf[6] = abStack_87[5];
        aStack_168._M_local_buf[7] = abStack_87[6];
        local_170 = true;
        local_178 = (undefined1  [8])&PTR__IArchive_0016d298;
        local_158._M_impl._0_4_ = MT_PNG;
        std::
        _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>,std::_Select1st<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>>
        ::_M_insert_unique<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>
                  ((_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>,std::_Select1st<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>>
                    *)local_188,(pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t> *)local_178);
        if (*(long *)(in_RSI + 0x118) == 0) {
          std::__cxx11::string::_M_assign(local_190);
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 !=
               &local_1e0.value_list._M_t._M_impl.super__Rb_tree_header);
    }
    if (((*(long *)(in_RSI + 0xa8) != 0) &&
        (__n = *(size_t *)(in_RSI + 0x118), __n == IMSC1_textProfile_abi_cxx11_._M_string_length))
       && ((__n == 0 ||
           (iVar10 = bcmp(*(void **)local_190,IMSC1_textProfile_abi_cxx11_._M_dataplus._M_p,__n),
           iVar10 == 0)))) {
      pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Warn(pIVar13,"Unexpected IMSC-1 text profile; document contains images.\n ");
    }
    if (*(long *)(in_RSI + 0x118) == 0) {
      pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Warn(pIVar13,"Using default IMSC-1 text profile.\n ");
      std::__cxx11::string::_M_assign(local_190);
    }
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"fontFamily","");
    local_178 = (undefined1  [8])&aStack_168;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_178,local_98._0_8_,
               (undefined1 *)(CONCAT71(local_98._9_7_,local_98[8]) + local_98._0_8_));
    local_158._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_158._M_impl.super__Rb_tree_header._M_header;
    local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_158._M_impl.super__Rb_tree_header._M_header._M_right =
         local_158._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,CONCAT71(abStack_87,local_98[0x10]) + 1);
    }
    Kumu::apply_visitor<Kumu::AttributeVisitor>((XMLElement *)in_RSI,(AttributeVisitor *)local_178);
    if ((_Rb_tree_header *)local_158._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_158._M_impl.super__Rb_tree_header) {
      local_190 = in_RSI + 0x80;
      local_128 = local_110;
      local_180 = (_func_int **)&PTR__IArchive_0016d298;
      p_Var11 = local_158._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        Kumu::PathBasename((string *)local_100,(char)(p_Var11 + 1));
        create_4122_type5_id((UUID *)local_50,(string *)local_100,s_font_id_prefix);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,CONCAT71(abStack_ef,local_100[0x10]) + 1);
        }
        __s = (char *)Kumu::bin2UUIDhex(local_50 + 9,0x10,local_98,0x40);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_100,__s,(allocator<char> *)&local_a8);
        local_188 = p_Var11 + 1;
        cVar7 = Kumu::PathIsFile((string *)local_100);
        cVar9 = '\x01';
        if (cVar7 == '\0') {
          local_120[0] = local_110;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_120,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          std::__cxx11::string::append((char *)local_120);
          cVar8 = Kumu::PathIsFile((string *)local_120);
          if (cVar8 != '\0') goto LAB_0014bf6b;
          local_c8[0] = local_b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c8,*(long *)(p_Var11 + 1),
                     (long)&(p_Var11[1]._M_parent)->_M_color + *(long *)(p_Var11 + 1));
          std::__cxx11::string::append((char *)local_c8);
          cVar9 = Kumu::PathIsFile((string *)local_c8);
          bVar3 = true;
        }
        else {
LAB_0014bf6b:
          bVar3 = false;
        }
        if ((bVar3) && (local_c8[0] != local_b8)) {
          operator_delete(local_c8[0],local_b8[0] + 1);
        }
        if ((cVar7 == '\0') && (local_120[0] != local_110)) {
          operator_delete(local_120[0],local_110[0] + 1);
        }
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,CONCAT71(abStack_ef,local_100[0x10]) + 1);
        }
        if (cVar9 == '\0') {
          pthread_mutex_lock((pthread_mutex_t *)&sg_default_font_family_list_lock);
          p_Var6 = local_188;
          iVar14 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find(&sg_default_font_family_list_abi_cxx11_._M_t,(key_type *)local_188);
          if ((_Rb_tree_header *)iVar14._M_node ==
              &sg_default_font_family_list_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
            pIVar13 = (ILogSink *)Kumu::DefaultLogSink();
            this = local_d8;
            Kumu::ILogSink::Error
                      (pIVar13,"Unable to locate external font resource \"%s\".\n",
                       *(undefined8 *)p_Var6);
            Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
            pthread_mutex_unlock((pthread_mutex_t *)&sg_default_font_family_list_lock);
            goto LAB_0014c16f;
          }
          pthread_mutex_unlock((pthread_mutex_t *)&sg_default_font_family_list_lock);
        }
        else {
          local_a8 = (_List_node_base *)local_50._9_8_;
          p_Stack_a0 = p_Stack_3f;
          p_Var12 = (_List_node_base *)operator_new(0x28);
          p_Var12[1]._M_next = local_a8;
          p_Var12[1]._M_prev = p_Stack_a0;
          *(undefined4 *)&p_Var12[2]._M_next = 2;
          std::__detail::_List_node_base::_M_hook(p_Var12);
          *(long *)(in_RSI + 0x160) = *(long *)(in_RSI + 0x160) + 1;
          local_100._9_7_ = SUB87(local_a8,0);
          local_100[0x10] = (byte_t)((ulong)local_a8 >> 0x38);
          abStack_ef = SUB87(p_Stack_a0,0);
          bStack_e8 = (byte_t)((ulong)p_Stack_a0 >> 0x38);
          local_100[8] = true;
          local_100._0_8_ = local_180;
          local_e0 = MT_OPENTYPE;
          std::
          _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>,std::_Select1st<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>>
          ::_M_insert_unique<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>
                    ((_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>,std::_Select1st<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>>
                      *)local_190,(pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t> *)local_100)
          ;
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != &local_158._M_impl.super__Rb_tree_header);
    }
    this = local_d8;
    Kumu::Result_t::Result_t((Result_t *)local_d8,(Result_t *)Kumu::RESULT_OK);
LAB_0014c16f:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_158);
    if (local_178 != (undefined1  [8])&aStack_168) {
      operator_delete((void *)local_178,
                      CONCAT71(aStack_168._M_allocated_capacity._1_7_,aStack_168._M_local_buf[0]) +
                      1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_1e0.value_list._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.attr_name._M_dataplus._M_p != &local_1e0.attr_name.field_2) {
      operator_delete(local_1e0.attr_name._M_dataplus._M_p,
                      CONCAT17(local_1e0.attr_name.field_2._M_local_buf[7],
                               CONCAT16(local_1e0.attr_name.field_2._M_local_buf[6],
                                        CONCAT24(local_1e0.attr_name.field_2._M_allocated_capacity.
                                                 _4_2_,local_1e0.attr_name.field_2.
                                                       _M_allocated_capacity._0_4_))) + 1);
    }
  }
  return this;
}

Assistant:

Result_t
AS_02::TimedText::ST2052_TextParser::h__TextParser::OpenRead()
{
  setup_default_font_family_list();

  if ( ! m_Root.ParseString(m_XMLDoc.c_str()) )
    {
      DefaultLogSink(). Error("ST 2052-1 document is not well-formed.\n");
      return RESULT_FORMAT;
    }

  m_TDesc.EncodingName = "UTF-8"; // the XML parser demands UTF-8
  m_TDesc.ResourceList.clear();
  m_TDesc.ContainerDuration = 0;
  std::set<std::string>::const_iterator i;

  // Attempt to set the profile from <conformsToStandard>
  if ( m_TDesc.NamespaceName.empty() )
    {
      ElementVisitor conforms_visitor("conformsToStandard");
      apply_visitor(m_Root, conforms_visitor);

      for ( i = conforms_visitor.value_list.begin(); i != conforms_visitor.value_list.end(); ++i )
	{
	  if ( *i == IMSC1_imageProfile || *i == IMSC1_textProfile )
	    {
	      m_TDesc.NamespaceName = *i;
	      break;
	    }
	}
    }

  // Attempt to set the profile from the use of attribute "profile"
  if ( m_TDesc.NamespaceName.empty() )
    {
      AttributeVisitor profile_visitor("profile");
      apply_visitor(m_Root, profile_visitor);

      for ( i = profile_visitor.value_list.begin(); i != profile_visitor.value_list.end(); ++i )
	{
	  if ( *i == IMSC1_imageProfile || *i == IMSC1_textProfile )
	    {
	      m_TDesc.NamespaceName = *i;
	      break;
	    }
	}
    }

  // Find image resources for later packaging as GS partitions.
  // Attempt to set the profile; infer from use of images.
  AttributeVisitor png_visitor("backgroundImage");
  apply_visitor(m_Root, png_visitor);

  for ( i = png_visitor.value_list.begin(); i != png_visitor.value_list.end(); ++i )
    {
      UUID asset_id = CreatePNGNameId(PathBasename(*i));
      TimedTextResourceDescriptor png_resource;
      memcpy(png_resource.ResourceID, asset_id.Value(), UUIDlen);
      png_resource.Type = ASDCP::TimedText::MT_PNG;
      m_TDesc.ResourceList.push_back(png_resource);
      m_ResourceTypes.insert(ResourceTypeMap_t::value_type(UUID(png_resource.ResourceID),
							   ASDCP::TimedText::MT_PNG));

      if ( m_TDesc.NamespaceName.empty() )
	{
	  m_TDesc.NamespaceName = IMSC1_imageProfile;
	}
    }

  // If images are present and profile is "text" make sure to say something.
  if ( ! m_ResourceTypes.empty() && m_TDesc.NamespaceName == IMSC1_textProfile )
    {
      DefaultLogSink().Warn("Unexpected IMSC-1 text profile; document contains images.\n ");
    }
  
  // If all else fails set the profile to "text".
  if ( m_TDesc.NamespaceName.empty() )
    {
      DefaultLogSink().Warn("Using default IMSC-1 text profile.\n ");
      m_TDesc.NamespaceName = IMSC1_textProfile;
    }

  // Find font resources for later packaging as GS partitions.
  AttributeVisitor font_visitor("fontFamily");
  apply_visitor(m_Root, font_visitor);
  char buf[64];

  for ( i = font_visitor.value_list.begin(); i != font_visitor.value_list.end(); ++i )
    {
      UUID font_id = CreateFontNameId(PathBasename(*i));

      if ( PathIsFile(font_id.EncodeHex(buf, 64))
	   || PathIsFile(*i+".ttf")
	   || PathIsFile(*i+".otf") )
	{
	  TimedTextResourceDescriptor font_resource;
	  memcpy(font_resource.ResourceID, font_id.Value(), UUIDlen);
	  font_resource.Type = ASDCP::TimedText::MT_OPENTYPE;
	  m_TDesc.ResourceList.push_back(font_resource);
	  m_ResourceTypes.insert(ResourceTypeMap_t::value_type(UUID(font_resource.ResourceID),
							       ASDCP::TimedText::MT_OPENTYPE));
	}
      else
	{
	  AutoMutex l(sg_default_font_family_list_lock);
	  if ( sg_default_font_family_list.find(*i) == sg_default_font_family_list.end() )
	    {
	      DefaultLogSink(). Error("Unable to locate external font resource \"%s\".\n", i->c_str());
	      return RESULT_FORMAT;
	    }
	}
    }

  return RESULT_OK;
}